

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O2

void __thiscall mjs::reference::reference(reference *this,object_ptr *base,string *property_name)

{
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this,&base->super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&this->property_name_,(gc_heap_ptr_untyped *)property_name);
  return;
}

Assistant:

explicit reference(const object_ptr& base, const string& property_name) : base_(base), property_name_(property_name) {
    }